

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O1

void auto_compaction_with_custom_cmp_function(void)

{
  fdb_status fVar1;
  size_t sVar2;
  size_t sVar3;
  fdb_file_info *kvs_config_00;
  void *__s2;
  ulong uVar4;
  uint uVar5;
  fdb_file_info *info;
  char *__format;
  fdb_kvs_handle *handle;
  undefined1 handle_00 [8];
  ulong uVar6;
  fdb_file_handle *file;
  fdb_kvs_handle *db1;
  fdb_kvs_handle *db3;
  fdb_kvs_handle *db2;
  fdb_kvs_config kvs_config;
  fdb_custom_cmp_variable functions [1];
  char *kvs_names [1];
  fdb_file_info file_info;
  timeval __test_begin;
  char keybuf [256];
  char bodybuf [256];
  fdb_kvs_handle *local_3c8;
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [8];
  undefined1 local_3a8 [80];
  ulong local_358;
  timeval local_338;
  fdb_file_info local_328 [3];
  fdb_file_info local_228 [3];
  fdb_config local_128;
  
  gettimeofday(&local_338,(__timezone_ptr_t)0x0);
  memleak_start();
  local_3a8._32_8_ = (btree *)0x0;
  local_3a8._24_8_ = _compact_test_keycmp;
  system("rm -rf  compact_test* > errorlog.txt");
  fdb_get_default_config();
  local_128.wal_threshold = 0x1000;
  local_128.compaction_mode = '\x01';
  local_128.compaction_threshold = '\n';
  local_128.compactor_sleep_duration = 1;
  info = (fdb_file_info *)0x14e0c5;
  handle = (fdb_kvs_handle *)&local_3c8;
  kvs_config_00 = (fdb_file_info *)0x1;
  fVar1 = fdb_open_custom_cmp((fdb_file_handle **)handle,"compact_test",&local_128,1,
                              (char **)(local_3a8 + 0x20),
                              (fdb_custom_cmp_variable *)(local_3a8 + 0x18),(void **)0x0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110eaf;
  fdb_get_default_kvs_config();
  local_3a8._16_8_ = local_328[0].doc_count;
  local_3a8._0_8_ = local_328[0].filename;
  local_3a8._8_8_ = local_328[0].new_filename;
  info = (fdb_file_info *)local_3c0;
  handle = local_3c8;
  fVar1 = fdb_kvs_open_default
                    ((fdb_file_handle *)local_3c8,(fdb_kvs_handle **)info,
                     (fdb_kvs_config *)local_3a8);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110eb4;
  info = (fdb_file_info *)local_3b0;
  kvs_config_00 = (fdb_file_info *)local_3a8;
  handle = local_3c8;
  fVar1 = fdb_kvs_open((fdb_file_handle *)local_3c8,(fdb_kvs_handle **)info,"db",
                       (fdb_kvs_config *)kvs_config_00);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110eb9;
  uVar4 = 0;
  do {
    sprintf((char *)local_328,"key%06d",uVar4);
    sprintf((char *)local_228,"body%06d",uVar4);
    handle = (fdb_kvs_handle *)local_3c0._0_8_;
    sVar2 = strlen((char *)local_328);
    sVar3 = strlen((char *)local_228);
    kvs_config_00 = local_228;
    info = local_328;
    fVar1 = fdb_set_kv(handle,local_328,sVar2,local_228,sVar3);
    handle_00 = local_3b0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
LAB_00110e9b:
      auto_compaction_with_custom_cmp_function();
      goto LAB_00110ea0;
    }
    sVar2 = strlen((char *)local_328);
    sVar3 = strlen((char *)local_228);
    kvs_config_00 = local_228;
    info = local_328;
    fVar1 = fdb_set_kv((fdb_kvs_handle *)handle_00,local_328,sVar2,local_228,sVar3);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      auto_compaction_with_custom_cmp_function();
      handle = (fdb_kvs_handle *)handle_00;
      goto LAB_00110e9b;
    }
    uVar5 = (int)uVar4 + 1;
    uVar4 = (ulong)uVar5;
  } while (uVar5 != 10000);
  kvs_config_00 = (fdb_file_info *)local_3a8;
  local_3a8._8_8_ = _compact_test_keycmp;
  info = (fdb_file_info *)(local_3c0 + 8);
  handle = local_3c8;
  fVar1 = fdb_kvs_open((fdb_file_handle *)local_3c8,(fdb_kvs_handle **)info,"db_custom",
                       (fdb_kvs_config *)kvs_config_00);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110ebe;
  info = local_328;
  sprintf((char *)info,"key%06d",0);
  kvs_config_00 = local_228;
  sprintf((char *)kvs_config_00,"body%06d",0);
  sVar2 = strlen((char *)info);
  sVar3 = strlen((char *)kvs_config_00);
  fVar1 = fdb_set_kv((fdb_kvs_handle *)local_3c0._8_8_,info,sVar2,kvs_config_00,sVar3);
  handle = (fdb_kvs_handle *)local_3c0._8_8_;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110ec3;
  info = (fdb_file_info *)0x0;
  handle = local_3c8;
  fVar1 = fdb_commit((fdb_file_handle *)local_3c8,'\0');
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110ec8;
  uVar4 = 0;
  uVar6 = 0;
  do {
    sprintf((char *)local_328,"key%06d",uVar6);
    sprintf((char *)local_228,"body%06d",uVar6);
    handle = (fdb_kvs_handle *)local_3c0._0_8_;
    sVar2 = strlen((char *)local_328);
    sVar3 = strlen((char *)local_228);
    kvs_config_00 = local_228;
    info = local_328;
    fVar1 = fdb_set_kv(handle,local_328,sVar2,local_228,sVar3);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110ea5;
    info = (fdb_file_info *)(local_3a8 + 0x28);
    handle = local_3c8;
    fVar1 = fdb_get_file_info((fdb_file_handle *)local_3c8,info);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110ea0;
    if (uVar4 < local_358) {
      uVar4 = local_358;
    }
    uVar5 = (int)uVar6 + 1;
    uVar6 = (ulong)uVar5;
  } while (uVar5 != 10000);
  info = (fdb_file_info *)0x0;
  handle = local_3c8;
  fVar1 = fdb_commit((fdb_file_handle *)local_3c8,'\0');
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110ecd;
  info = (fdb_file_info *)(local_3a8 + 0x28);
  handle = local_3c8;
  fVar1 = fdb_get_file_info((fdb_file_handle *)local_3c8,info);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110ed2;
  if (uVar4 < local_358) {
    uVar4 = local_358;
  }
  printf("wait for daemon compaction completion... (max file size: %lu)\n",uVar4);
  do {
    sleep(1);
    info = (fdb_file_info *)(local_3a8 + 0x28);
    handle = local_3c8;
    fVar1 = fdb_get_file_info((fdb_file_handle *)local_3c8,(fdb_file_info *)(local_3a8 + 0x28));
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110eaa;
  } while (uVar4 <= local_358);
  fVar1 = fdb_close((fdb_file_handle *)local_3c8);
  handle = local_3c8;
  if (fVar1 == FDB_RESULT_SUCCESS) {
    fVar1 = fdb_shutdown();
    handle = local_3c8;
    if (fVar1 == FDB_RESULT_SUCCESS) {
      memleak_end();
      __format = "%s PASSED\n";
      if (auto_compaction_with_custom_cmp_function()::__test_pass != '\0') {
        __format = "%s FAILED\n";
      }
      fprintf(_stderr,__format,"auto compaction with custom comparison function");
      return;
    }
    goto LAB_00110edc;
  }
  goto LAB_00110ed7;
LAB_00110ea0:
  auto_compaction_with_custom_cmp_function();
LAB_00110ea5:
  auto_compaction_with_custom_cmp_function();
LAB_00110eaa:
  auto_compaction_with_custom_cmp_function();
LAB_00110eaf:
  auto_compaction_with_custom_cmp_function();
LAB_00110eb4:
  auto_compaction_with_custom_cmp_function();
LAB_00110eb9:
  auto_compaction_with_custom_cmp_function();
LAB_00110ebe:
  auto_compaction_with_custom_cmp_function();
LAB_00110ec3:
  auto_compaction_with_custom_cmp_function();
LAB_00110ec8:
  auto_compaction_with_custom_cmp_function();
LAB_00110ecd:
  auto_compaction_with_custom_cmp_function();
LAB_00110ed2:
  auto_compaction_with_custom_cmp_function();
LAB_00110ed7:
  auto_compaction_with_custom_cmp_function();
LAB_00110edc:
  auto_compaction_with_custom_cmp_function();
  if (info == kvs_config_00) {
    memcmp(handle,__s2,(size_t)info);
    return;
  }
  if (info < kvs_config_00) {
    kvs_config_00 = info;
  }
  memcmp(handle,__s2,(size_t)kvs_config_00);
  return;
}

Assistant:

void auto_compaction_with_custom_cmp_function()
{
    TEST_INIT();

    memleak_start();

    int i, r, n=10000;
    char keybuf[256], bodybuf[256];
    uint64_t max_filesize = 0;
    fdb_file_handle *file;
    fdb_kvs_handle *db1, *db2, *db3;
    fdb_status status;
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_file_info file_info;
    char *kvs_names[] = {NULL};
    fdb_custom_cmp_variable functions[] = {_compact_test_keycmp};

    r = system(SHELL_DEL" compact_test* > errorlog.txt");
    (void)r;

    // Open Database File
    config = fdb_get_default_config();
    config.wal_threshold = 4096; // reset WAL threshold for correct file size estimation
    config.compaction_mode=FDB_COMPACTION_AUTO;
    config.compactor_sleep_duration = 1;
    config.compaction_threshold = 10;
    status = fdb_open_custom_cmp(&file, "compact_test", &config,
                                 1, kvs_names, functions, NULL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Open 2 KV Stores
    kvs_config = fdb_get_default_kvs_config();
    status = fdb_kvs_open_default(file, &db1, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open(file, &db2, "db", &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // initial load
    for(i=0;i<n;i++) {
        sprintf(keybuf, "key%06d", i);
        sprintf(bodybuf, "body%06d", i);
        status = fdb_set_kv(db1, keybuf, strlen(keybuf),
                                 bodybuf, strlen(bodybuf));
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_set_kv(db2, keybuf, strlen(keybuf),
                                 bodybuf, strlen(bodybuf));
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // create one more KVS using custom cmp
    // it doesn't exist on the initial cmp_func list
    kvs_config.custom_cmp = _compact_test_keycmp;
    status = fdb_kvs_open(file, &db3, "db_custom", &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    i = 0;
    sprintf(keybuf, "key%06d", i);
    sprintf(bodybuf, "body%06d", i);
    status = fdb_set_kv(db3, keybuf, strlen(keybuf),
                             bodybuf, strlen(bodybuf));
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Commit
    status = fdb_commit(file, FDB_COMMIT_NORMAL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // update to trigger compaction
    for(i=0;i<n;i++) {
        sprintf(keybuf, "key%06d", i);
        sprintf(bodybuf, "body%06d", i);
        status = fdb_set_kv(db1, keybuf, strlen(keybuf),
                                 bodybuf, strlen(bodybuf));
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        status = fdb_get_file_info(file, &file_info);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        if (file_info.file_size > max_filesize) {
            max_filesize = file_info.file_size;
        }
    }
    // Commit
    status = fdb_commit(file, FDB_COMMIT_NORMAL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_get_file_info(file, &file_info);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    if (file_info.file_size > max_filesize) {
        max_filesize = file_info.file_size;
    }

    printf("wait for daemon compaction completion... (max file size: %" _F64 ")\n", max_filesize);
    while (true) {
        sleep(1);

        status = fdb_get_file_info(file, &file_info);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        if (file_info.file_size < max_filesize) {
            break;
        }
    }
    // should be compacted
    TEST_CHK(file_info.file_size < max_filesize);

    status = fdb_close(file);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_shutdown();
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    memleak_end();

    TEST_RESULT("auto compaction with custom comparison function");
}